

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all_at_one.cpp
# Opt level: O3

void * parallel_inc(void *arg)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"thread #",8);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  **arg = **arg + 1;
  return (void *)0x0;
}

Assistant:

void *parallel_inc(void * arg){
  auto p = reinterpret_cast<Argument *>(arg);
  while(*(p->x) != p->n);
  //usleep(1);
  std::cout << "thread #" << p->n << std::endl;
  ++*(p->x);
  return nullptr;
}